

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

void __thiscall
cmFileCommand::AddEvaluationFile
          (cmFileCommand *this,string *inputName,string *outputExpr,string *condition,
          bool inputIsContent)

{
  undefined8 uVar1;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> outputCge;
  cmGeneratorExpression conditionGe;
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  auto_ptr<cmCompiledGeneratorExpression> local_118;
  auto_ptr<cmCompiledGeneratorExpression> local_110;
  auto_ptr<cmCompiledGeneratorExpression> local_108;
  auto_ptr<cmCompiledGeneratorExpression> local_100;
  undefined1 local_f8 [72];
  cmGeneratorExpression local_b0;
  cmListFileBacktrace local_70;
  
  cmMakefile::GetBacktrace(&local_70,(this->super_cmCommand).Makefile);
  cmGeneratorExpression::cmGeneratorExpression(&local_b0,&local_70);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)(local_f8 + 8),(string *)&local_b0);
  local_118.x_ = (cmCompiledGeneratorExpression *)local_f8._8_8_;
  local_f8._8_8_ = 0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_f8 + 8));
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)(local_f8 + 8),&local_70);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_f8,(string *)(local_f8 + 8));
  uVar1 = local_f8._0_8_;
  local_f8._0_8_ = (pointer)0x0;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_f8);
  local_108.x_ = local_118.x_;
  local_118.x_ = (cmCompiledGeneratorExpression *)0x0;
  local_100.x_ = (cmCompiledGeneratorExpression *)0x0;
  local_110.x_ = (cmCompiledGeneratorExpression *)uVar1;
  cmMakefile::AddEvaluationFile
            ((this->super_cmCommand).Makefile,inputName,&local_108,&local_110,inputIsContent);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_110);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_108);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_100);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_f8 + 8));
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_118);
  cmGeneratorExpression::~cmGeneratorExpression(&local_b0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_70);
  return;
}

Assistant:

void cmFileCommand::AddEvaluationFile(const std::string &inputName,
                                      const std::string &outputExpr,
                                      const std::string &condition,
                                      bool inputIsContent
                                     )
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  cmGeneratorExpression outputGe(lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> outputCge
                                                = outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> conditionCge
                                              = conditionGe.Parse(condition);

  this->Makefile->AddEvaluationFile(inputName, outputCge,
                                    conditionCge, inputIsContent);
}